

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O1

void __thiscall nvim::Nvim::win_del_var(Nvim *this,Window window,string *name)

{
  string local_78;
  Window local_58;
  variant<_cf2d41c5_> local_50;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_58 = window;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"nvim_win_del_var","");
  NvimRPC::do_call<long,std::__cxx11::string>
            ((Object *)&local_50,&this->client_,&local_78,&local_58,name);
  boost::variant<$cf2d41c5$>::destroy_content(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Nvim::win_del_var(Window window, const std::string& name) {
    client_.call("nvim_win_del_var", nullptr, window, name);
}